

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

double __thiscall
imrt::EvaluationFunction::get_delta_eval
          (EvaluationFunction *this,int angle,int b,double delta_intensity,
          vector<double,_std::allocator<double>_> *w,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int n_voxels)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  reference ppVar4;
  Matrix *this_00;
  const_reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  vector<double,_std::allocator<double>_> *in_RCX;
  int in_EDX;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double in_XMM0_Qa;
  double dVar9;
  __type_conflict _Var10;
  int in_stack_00000008;
  double pen;
  double delta;
  Matrix *Dep;
  int k;
  int o;
  pair<const_double,_std::pair<int,_int>_> voxel;
  iterator __end1;
  iterator __begin1;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__range1;
  int i;
  double delta_F;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  key_type *in_stack_fffffffffffffe28;
  Volume *in_stack_fffffffffffffe30;
  Volume *local_d8;
  int iStack_a0;
  int iStack_9c;
  _Self local_90;
  _Self local_88;
  undefined1 *local_80;
  int local_74;
  double local_70;
  pair<int,_int> local_68;
  undefined1 local_60 [48];
  vector<double,_std::allocator<double>_> *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  double local_18;
  int local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  local_68 = std::make_pair<int&,int&>(&in_stack_fffffffffffffe28->first,(int *)0x125c08);
  std::
  unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
  ::at((unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
        *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffe30,
             (multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffe28);
  local_70 = 0.0;
  local_74 = 0;
  local_80 = local_60;
  local_88._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::begin((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                *)in_stack_fffffffffffffe28);
  local_90._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::end((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffe28);
  while (bVar3 = std::operator!=(&local_88,&local_90), bVar3) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
                        0x125cb1);
    iStack_a0 = (ppVar4->second).first;
    iStack_9c = (ppVar4->second).second;
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
              (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
               (long)iStack_a0);
    this_00 = Volume::getDepositionMatrix
                        (in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    dVar9 = maths::Matrix::operator()(this_00,iStack_9c,local_10);
    dVar9 = dVar9 * local_18;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      local_d8 = (Volume *)0x0;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)iStack_a0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
      dVar1 = *pvVar6;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
      if (*pvVar7 <= dVar1) {
LAB_00125f44:
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)iStack_a0);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
        dVar1 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
        if (*pvVar7 <= dVar1) {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)iStack_a0);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
          dVar1 = *pvVar6;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_28,(long)iStack_a0);
          if (dVar1 + dVar9 < *pvVar7) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_20,(long)iStack_a0);
            dVar1 = *pvVar7;
            std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_RDI + 0x10),(long)iStack_a0);
            std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
            _Var10 = std::pow<double,int>
                               ((double)in_stack_fffffffffffffe30,
                                (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            local_d8 = (Volume *)(dVar1 * _Var10 + 0.0);
          }
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_20,(long)iStack_a0);
          dVar1 = *pvVar7;
          std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)iStack_a0);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
          _Var10 = std::pow<double,int>
                             ((double)in_stack_fffffffffffffe30,
                              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          local_d8 = (Volume *)(-dVar1 * _Var10 + 0.0);
        }
      }
      else {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)iStack_a0);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
        dVar1 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
        if (*pvVar7 <= dVar1 + dVar9) goto LAB_00125f44;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iStack_a0);
        dVar1 = *pvVar7;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)iStack_a0);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
        dVar2 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
        local_d8 = (Volume *)(dVar1 * dVar9 * ((dVar2 - *pvVar7) + (dVar2 - *pvVar7) + dVar9) + 0.0)
        ;
      }
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)iStack_a0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
      dVar1 = *pvVar6;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
      if (dVar1 < *pvVar7 || dVar1 == *pvVar7) {
LAB_00126342:
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)iStack_a0);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
        dVar1 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
        if (dVar1 < *pvVar7 || dVar1 == *pvVar7) {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)iStack_a0);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
          dVar1 = *pvVar6;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_30,(long)iStack_a0);
          if (*pvVar7 <= dVar1 + dVar9 && dVar1 + dVar9 != *pvVar7) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_20,(long)iStack_a0);
            dVar9 = *pvVar7;
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_RDI + 0x10),(long)iStack_a0);
            std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
            std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
            _Var10 = std::pow<double,int>
                               ((double)in_stack_fffffffffffffe30,
                                (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            local_d8 = (Volume *)(dVar9 * _Var10 + (double)local_d8);
          }
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_20,(long)iStack_a0);
          dVar9 = *pvVar7;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 0x10),(long)iStack_a0);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
          std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
          _Var10 = std::pow<double,int>
                             ((double)in_stack_fffffffffffffe30,
                              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          local_d8 = (Volume *)(-dVar9 * _Var10 + (double)local_d8);
        }
      }
      else {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)iStack_a0);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
        dVar1 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
        if (dVar1 + dVar9 < *pvVar7 || dVar1 + dVar9 == *pvVar7) goto LAB_00126342;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iStack_a0);
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
        dVar2 = *pvVar7;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)iStack_a0);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iStack_9c);
        local_d8 = (Volume *)
                   (dVar1 * dVar9 * (-dVar2 + *pvVar6 + -dVar2 + *pvVar6 + dVar9) + (double)local_d8
                   );
      }
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)iStack_a0);
      local_70 = (double)local_d8 / (double)*pvVar8 + local_70;
      local_74 = local_74 + 1;
      in_stack_fffffffffffffe30 = local_d8;
      if (in_stack_00000008 < local_74) break;
    }
    std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffe30);
  }
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
               *)0x12661c);
  return local_70;
}

Assistant:

double EvaluationFunction::get_delta_eval(int angle, int b, double delta_intensity,
	vector<double>& w, vector<double>& Zmin, vector<double>& Zmax,int n_voxels) const{

	 multimap<double, pair<int,int> > voxels =
	                                   beamlet2voxel_list.at(make_pair(angle,b));
	 double delta_F=0.0;

	 int i=0;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 double delta = Dep(k,b)*(delta_intensity);
		 if(delta==0.0) continue;

		 double pen=0.0;
 		 //with the change in the dose of a voxel we can incrementally modify the value of F
 		 if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
 			pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
 		 else if(Z[o][k] < Zmin[o]) //the penalty disappears
 			pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
 		 else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
 			pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );

 		 if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
 			 pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
 		 else if(Z[o][k] > Zmax[o]) //the penalty disappears
 			 pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
 		 else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
 			 pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );

 		 delta_F += pen/nb_voxels[o];
		 i++; if(i>n_voxels) break;
	 }
	 return delta_F;
}